

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O3

wchar_t recharge_failure_chance(object *obj,wchar_t strength)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar2 = (100 - obj->kind->level) / 10 + strength + (obj->pval / (short)(ushort)obj->number) * -2;
  wVar1 = L'\x01';
  if (L'\x01' < wVar2) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

int recharge_failure_chance(const struct object *obj, int strength) {
	/* Ease of recharge ranges from 9 down to 4 (wands) or 3 (staffs) */
	int ease_of_recharge = (100 - obj->kind->level) / 10;
	int raw_chance = strength + ease_of_recharge
		- 2 * (obj->pval / obj->number);
	return raw_chance > 1 ? raw_chance : 1;
}